

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool google::ParseTemplateArgs(State *state)

{
  bool bVar1;
  undefined1 local_48 [8];
  State copy;
  State *state_local;
  
  copy._40_8_ = state;
  memcpy(local_48,state,0x30);
  DisableAppend((State *)copy._40_8_);
  bVar1 = ParseOneCharToken((State *)copy._40_8_,'I');
  if (((bVar1) && (bVar1 = OneOrMore(ParseTemplateArg,(State *)copy._40_8_), bVar1)) &&
     (bVar1 = ParseOneCharToken((State *)copy._40_8_,'E'), bVar1)) {
    RestoreAppend((State *)copy._40_8_,(bool)(copy.prev_name._6_1_ & 1));
    MaybeAppend((State *)copy._40_8_,"<>");
    state_local._7_1_ = true;
  }
  else {
    memcpy((void *)copy._40_8_,local_48,0x30);
    state_local._7_1_ = false;
  }
  return state_local._7_1_;
}

Assistant:

static bool ParseTemplateArgs(State *state) {
  State copy = *state;
  DisableAppend(state);
  if (ParseOneCharToken(state, 'I') &&
      OneOrMore(ParseTemplateArg, state) &&
      ParseOneCharToken(state, 'E')) {
    RestoreAppend(state, copy.append);
    MaybeAppend(state, "<>");
    return true;
  }
  *state = copy;
  return false;
}